

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

void __thiscall Fl_Help_View::free_data(Fl_Help_View *this)

{
  byte c;
  int iVar1;
  int H;
  char *pcVar2;
  Fl_Shared_Image *this_00;
  void *extraout_RDX;
  void *pvVar3;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  Fl_Help_View *pFVar4;
  byte *pbVar5;
  byte *p;
  HV_Edit_Buffer buf;
  char hattr [1024];
  char attr [1024];
  char wattr [1024];
  _func_int **local_c50;
  undefined4 local_c48;
  Fl_Callback *local_c40;
  
  pbVar5 = (byte *)this->value_;
  if (pbVar5 != (byte *)0x0) {
    local_c50 = (_func_int **)0x40000000000;
    local_c48 = 0x400;
    local_c40 = (Fl_Callback *)malloc(0x400);
    pvVar3 = extraout_RDX;
    while( true ) {
      while (*pbVar5 == 0x3c) {
        if (((pbVar5[1] == 0x21) && (pbVar5[2] == 0x2d)) && (pbVar5[3] == 0x2d)) {
          pcVar2 = strstr((char *)(pbVar5 + 4),"-->");
          if (pcVar2 == (char *)0x0) goto LAB_001b45eb;
          pbVar5 = (byte *)(pcVar2 + 3);
          pvVar3 = extraout_RDX_00;
        }
        else {
          local_c50 = (_func_int **)((ulong)local_c50 & 0xffffffff00000000);
          *local_c40 = (Fl_Callback)0x0;
          p = pbVar5;
          while( true ) {
            p = p + 1;
            c = *p;
            pbVar5 = p;
            if (((c == 0) || (c == 0x3e)) ||
               (iVar1 = isspace((uint)c), pvVar3 = extraout_RDX_01, iVar1 != 0)) break;
            HV_Edit_Buffer::add((HV_Edit_Buffer *)&stack0xfffffffffffff3b0,c);
            pvVar3 = extraout_RDX_02;
          }
          while ((c != 0 && (c != 0x3e))) {
            c = pbVar5[1];
            pbVar5 = pbVar5 + 1;
          }
          pbVar5 = pbVar5 + (c == 0x3e);
          pFVar4 = (Fl_Help_View *)&stack0xfffffffffffff3b0;
          iVar1 = HV_Edit_Buffer::cmp((HV_Edit_Buffer *)&stack0xfffffffffffff3b0,"IMG",pvVar3);
          pvVar3 = extraout_RDX_03;
          if (iVar1 != 0) {
            get_attr(pFVar4,(char *)p,"WIDTH",&stack0xfffffffffffffbc8,0x400);
            get_attr(pFVar4,(char *)p,"HEIGHT",&stack0xfffffffffffff3c8,0x400);
            iVar1 = get_length(this,&stack0xfffffffffffffbc8);
            pFVar4 = this;
            H = get_length(this,&stack0xfffffffffffff3c8);
            pcVar2 = get_attr(pFVar4,(char *)p,"SRC",&stack0xfffffffffffff7c8,0x400);
            pvVar3 = extraout_RDX_04;
            if ((pcVar2 != (char *)0x0) &&
               (this_00 = get_image(this,&stack0xfffffffffffff7c8,iVar1,H), pvVar3 = extraout_RDX_05
               , this_00 != (Fl_Shared_Image *)&broken_image)) {
              Fl_Shared_Image::release(this_00);
              pvVar3 = extraout_RDX_06;
            }
          }
        }
      }
      if (*pbVar5 == 0) break;
      pbVar5 = pbVar5 + 1;
    }
LAB_001b45eb:
    free(this->value_);
    this->value_ = (char *)0x0;
    free(local_c40);
  }
  if (this->nblocks_ != 0) {
    free(this->blocks_);
    this->nblocks_ = 0;
    this->ablocks_ = 0;
    this->blocks_ = (Fl_Help_Block *)0x0;
  }
  if (this->nlinks_ != 0) {
    free(this->links_);
    this->nlinks_ = 0;
    this->alinks_ = 0;
    this->links_ = (Fl_Help_Link *)0x0;
  }
  if (this->ntargets_ != 0) {
    free(this->targets_);
    this->ntargets_ = 0;
    this->atargets_ = 0;
    this->targets_ = (Fl_Help_Target *)0x0;
  }
  return;
}

Assistant:

void
Fl_Help_View::free_data() {
  // Release all images...
  if (value_) {
    const char	*ptr,		// Pointer into block
		*attrs;		// Pointer to start of element attributes
    HV_Edit_Buffer buf;		// Text buffer
    char	attr[1024],	// Attribute buffer
		wattr[1024],	// Width attribute buffer
		hattr[1024];	// Height attribute buffer

    DEBUG_FUNCTION(__LINE__,__FUNCTION__);

    for (ptr = value_; *ptr;)
    {
      if (*ptr == '<')
      {
	ptr ++;

        if (strncmp(ptr, "!--", 3) == 0)
	{
	  // Comment...
	  ptr += 3;
	  if ((ptr = strstr(ptr, "-->")) != NULL)
	  {
	    ptr += 3;
	    continue;
	  }
	  else
	    break;
	}

        buf.clear();

	while (*ptr && *ptr != '>' && !isspace((*ptr)&255))
	  buf.add(*ptr++);

	attrs = ptr;
	while (*ptr && *ptr != '>')
          ptr ++;

	if (*ptr == '>')
          ptr ++;

	if (buf.cmp("IMG"))
	{
	  Fl_Shared_Image	*img;
	  int		width;
	  int		height;

          get_attr(attrs, "WIDTH", wattr, sizeof(wattr));
          get_attr(attrs, "HEIGHT", hattr, sizeof(hattr));
	  width  = get_length(wattr);
	  height = get_length(hattr);

	  if (get_attr(attrs, "SRC", attr, sizeof(attr))) {
	    // Get and release the image to free it from memory...
	    img = get_image(attr, width, height);
	    if ((void*)img != &broken_image) {
	      img->release();
	    }
	  }
	}
      }
      else
        ptr ++;
    }

    free((void *)value_);
    value_ = 0;
  }

  // Free all of the arrays...
  if (nblocks_) {
    free(blocks_);

    ablocks_ = 0;
    nblocks_ = 0;
    blocks_  = 0;
  }

  if (nlinks_) {
    free(links_);

    alinks_ = 0;
    nlinks_ = 0;
    links_  = 0;
  }

  if (ntargets_) {
    free(targets_);

    atargets_ = 0;
    ntargets_ = 0;
    targets_  = 0;
  }
}